

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void snowhouse::DefaultFailureHandler::
     Handle<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>,int>
               (ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
                *expected,int *actual,char *file_name,int line_number)

{
  ostream *poVar1;
  AssertionException *this;
  ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
  *builder;
  int *value;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  poVar1 = std::operator<<((ostream *)&str,"Expected: ");
  Stringizer<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>>
  ::ToString_abi_cxx11_
            (&local_1e8,
             (Stringizer<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>>
              *)expected,builder);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1e8);
  poVar1 = std::operator<<((ostream *)&str,"Actual: ");
  detail::DefaultStringizer<int,true>::ToString_abi_cxx11_
            (&local_1e8,(DefaultStringizer<int,true> *)actual,value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1e8);
  this = (AssertionException *)__cxa_allocate_exception(0x50);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1c8,file_name,&local_1e9);
  AssertionException::AssertionException(this,&local_1e8,&local_1c8,line_number);
  __cxa_throw(this,&AssertionException::typeinfo,AssertionException::~AssertionException);
}

Assistant:

static void Handle(const ExpectedType& expected, const ActualType& actual, const char* file_name, int line_number)
      {
         std::ostringstream str;

         str << "Expected: " << snowhouse::Stringize(expected) << std::endl;
         str << "Actual: " << snowhouse::Stringize(actual) << std::endl;

         throw AssertionException(str.str(), file_name, line_number);
      }